

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

void __thiscall minibag::StreamFactory::StreamFactory(StreamFactory *this,ChunkedFile *file)

{
  LZ4Stream *this_00;
  long in_RDI;
  LZ4Stream *__p;
  ChunkedFile *file_00;
  ChunkedFile *in_stack_ffffffffffffff98;
  BZ2Stream *in_stack_ffffffffffffffa0;
  LZ4Stream *this_01;
  
  operator_new(0x10);
  UncompressedStream::UncompressedStream
            ((UncompressedStream *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::shared_ptr<minibag::Stream>::shared_ptr<minibag::UncompressedStream,void>
            ((shared_ptr<minibag::Stream> *)in_stack_ffffffffffffffa0,
             (UncompressedStream *)in_stack_ffffffffffffff98);
  __p = (LZ4Stream *)(in_RDI + 0x10);
  this_01 = __p;
  std::shared_ptr<minibag::Stream>::shared_ptr((shared_ptr<minibag::Stream> *)0x178dc8);
  file_00 = (ChunkedFile *)(in_RDI + 0x20);
  std::shared_ptr<minibag::Stream>::shared_ptr((shared_ptr<minibag::Stream> *)0x178ddb);
  this_00 = (LZ4Stream *)operator_new(0x30);
  BZ2Stream::BZ2Stream(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__shared_ptr<minibag::Stream,_(__gnu_cxx::_Lock_policy)2>::reset<minibag::BZ2Stream>
            ((__shared_ptr<minibag::Stream,_(__gnu_cxx::_Lock_policy)2> *)this_01,(BZ2Stream *)__p);
  operator_new(0x50);
  LZ4Stream::LZ4Stream(this_00,file_00);
  std::__shared_ptr<minibag::Stream,_(__gnu_cxx::_Lock_policy)2>::reset<minibag::LZ4Stream>
            ((__shared_ptr<minibag::Stream,_(__gnu_cxx::_Lock_policy)2> *)this_01,__p);
  return;
}

Assistant:

StreamFactory::StreamFactory(ChunkedFile* file) :
    uncompressed_stream_(new UncompressedStream(file))
{
#ifdef MINIBAG_HAS_BZIP2
	bz2_stream_.reset(new BZ2Stream(file));
#endif

#ifdef MINIBAG_HAS_LZ4
	lz4_stream_.reset(new LZ4Stream(file));
#endif
}